

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

PropertyIndex __thiscall
Js::DictionaryTypeHandlerBase<int>::GetPropertyIndex
          (DictionaryTypeHandlerBase<int> *this,PropertyRecord *propertyRecord)

{
  bool bVar1;
  int iVar2;
  PropertyRecord *local_20;
  int local_14;
  DictionaryPropertyDescriptor<int> *pDStack_10;
  int i;
  DictionaryPropertyDescriptor<int> *descriptor;
  
  local_20 = propertyRecord;
  bVar1 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_20,&stack0xfffffffffffffff0,&local_14);
  if ((bVar1) && ((pDStack_10->Attributes & 8) == 0)) {
    iVar2 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<false>(pDStack_10);
    if (iVar2 < 0xffff) goto LAB_00daaf75;
  }
  iVar2 = 0xffff;
LAB_00daaf75:
  return (PropertyIndex)iVar2;
}

Assistant:

PropertyIndex DictionaryTypeHandlerBase<T>::GetPropertyIndex(PropertyRecord const* propertyRecord)
    {
        return GetPropertyIndex_Internal<false>(propertyRecord);
    }